

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpInsert::TypeOpInsert(TypeOpInsert *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"INSERT","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_INSERT,&local_38);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0af0;
  (this->super_TypeOpFunc).metaout = TYPE_UNKNOWN;
  (this->super_TypeOpFunc).metain = TYPE_INT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c08f0;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x20000;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cb180;
  pOVar1->opcode = CPUI_INSERT;
  pOVar1->isunary = false;
  pOVar1->isspecial = true;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpInsert::TypeOpInsert(TypeFactory *t)
  : TypeOpFunc(t,CPUI_INSERT,"INSERT",TYPE_UNKNOWN,TYPE_INT)
{
  opflags = PcodeOp::special;
  behave = new OpBehavior(CPUI_INSERT,false,true);	// Dummy behavior
}